

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_twin_messenger.c
# Opt level: O3

TWIN_MESSENGER_HANDLE twin_messenger_create(TWIN_MESSENGER_CONFIG *messenger_config)

{
  pfTransport_GetOption_Product_Info_Callback p_Var1;
  void *pvVar2;
  int iVar3;
  TWIN_MESSENGER_INSTANCE_conflict *twin_msgr;
  LOGGER_LOG p_Var4;
  SINGLYLINKEDLIST_HANDLE pSVar5;
  MAP_HANDLE handle;
  AMQP_MESSENGER_HANDLE messenger_handle;
  char *pcVar6;
  char *pcVar7;
  AMQP_MESSENGER_CONFIG local_a8;
  
  if (messenger_config == (TWIN_MESSENGER_CONFIG *)0x0) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 == (LOGGER_LOG)0x0) {
      return (TWIN_MESSENGER_HANDLE)0x0;
    }
    pcVar7 = "Invalid argument (messenger_config is NULL)";
    iVar3 = 0x677;
LAB_001384a3:
    (*p_Var4)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
              ,"twin_messenger_create",iVar3,1,pcVar7);
    return (TWIN_MESSENGER_HANDLE)0x0;
  }
  pcVar7 = messenger_config->device_id;
  if (((pcVar7 == (char *)0x0) || (messenger_config->iothub_host_fqdn == (char *)0x0)) ||
     (p_Var1 = messenger_config->prod_info_cb,
     p_Var1 == (pfTransport_GetOption_Product_Info_Callback)0x0)) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 == (LOGGER_LOG)0x0) {
      return (TWIN_MESSENGER_HANDLE)0x0;
    }
    pcVar7 = "Invalid argument (device_id=%p, iothub_host_fqdn=%p, client_version=%p)";
    iVar3 = 0x67d;
    goto LAB_001384a3;
  }
  twin_msgr = (TWIN_MESSENGER_INSTANCE_conflict *)calloc(1,0x80);
  if (twin_msgr == (TWIN_MESSENGER_INSTANCE_conflict *)0x0) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 == (LOGGER_LOG)0x0) {
      return (TWIN_MESSENGER_HANDLE)0x0;
    }
    pcVar7 = "Failed allocating TWIN_MESSENGER_INSTANCE (%s)";
    iVar3 = 0x684;
    goto LAB_001384a3;
  }
  twin_msgr->state = TWIN_MESSENGER_STATE_STOPPED;
  twin_msgr->subscription_state = TWIN_SUBSCRIPTION_STATE_NOT_SUBSCRIBED;
  twin_msgr->amqp_msgr_state = AMQP_MESSENGER_STATE_STOPPED;
  twin_msgr->prod_info_cb = p_Var1;
  twin_msgr->prod_info_ctx = messenger_config->prod_info_ctx;
  iVar3 = mallocAndStrcpy_s(&twin_msgr->device_id,pcVar7);
  if (iVar3 == 0) {
    if ((messenger_config->module_id == (char *)0x0) ||
       (iVar3 = mallocAndStrcpy_s(&twin_msgr->module_id,messenger_config->module_id), iVar3 == 0)) {
      iVar3 = mallocAndStrcpy_s(&twin_msgr->iothub_host_fqdn,messenger_config->iothub_host_fqdn);
      if (iVar3 == 0) {
        pSVar5 = singlylinkedlist_create();
        twin_msgr->pending_patches = pSVar5;
        if (pSVar5 == (SINGLYLINKEDLIST_HANDLE)0x0) {
          p_Var4 = xlogging_get_log_function();
          if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_00138421;
          pcVar7 = messenger_config->device_id;
          pcVar6 = "Failed creating list for queueing patches (%s)";
          iVar3 = 0x6a6;
        }
        else {
          pSVar5 = singlylinkedlist_create();
          twin_msgr->operations = pSVar5;
          if (pSVar5 == (SINGLYLINKEDLIST_HANDLE)0x0) {
            p_Var4 = xlogging_get_log_function();
            if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_00138421;
            pcVar7 = messenger_config->device_id;
            pcVar6 = "Failed creating list for operations (%s)";
            iVar3 = 0x6ac;
          }
          else {
            handle = create_link_attach_properties(twin_msgr);
            if (handle != (MAP_HANDLE)0x0) {
              local_a8.prod_info_cb = messenger_config->prod_info_cb;
              twin_msgr->prod_info_cb = local_a8.prod_info_cb;
              local_a8.prod_info_ctx = messenger_config->prod_info_ctx;
              twin_msgr->prod_info_ctx = local_a8.prod_info_ctx;
              local_a8.device_id = twin_msgr->device_id;
              local_a8.module_id = twin_msgr->module_id;
              local_a8.iothub_host_fqdn = twin_msgr->iothub_host_fqdn;
              local_a8.send_link.target_suffix = "twin";
              local_a8.send_link.rcv_settle_mode = '\0';
              local_a8.send_link.snd_settle_mode = '\x01';
              local_a8.receive_link.source_suffix = "twin";
              local_a8.receive_link.rcv_settle_mode = '\0';
              local_a8.receive_link.snd_settle_mode = '\x01';
              local_a8.on_state_changed_callback = on_amqp_messenger_state_changed_callback;
              local_a8.on_subscription_changed_callback =
                   on_amqp_messenger_subscription_changed_callback;
              local_a8.send_link.attach_properties = handle;
              local_a8.receive_link.attach_properties = handle;
              local_a8.on_state_changed_context = twin_msgr;
              local_a8.on_subscription_changed_context = twin_msgr;
              messenger_handle = amqp_messenger_create(&local_a8);
              twin_msgr->amqp_msgr = messenger_handle;
              if (messenger_handle == (AMQP_MESSENGER_HANDLE)0x0) {
                p_Var4 = xlogging_get_log_function();
                if (p_Var4 != (LOGGER_LOG)0x0) {
                  pcVar7 = messenger_config->device_id;
                  pcVar6 = "Failed creating the AMQP messenger (%s)";
                  iVar3 = 0x6d0;
LAB_00138782:
                  (*p_Var4)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                            ,"twin_messenger_create",iVar3,1,pcVar6,pcVar7);
                }
              }
              else {
                iVar3 = amqp_messenger_subscribe_for_messages
                                  (messenger_handle,on_amqp_message_received_callback,twin_msgr);
                if (iVar3 == 0) {
                  pvVar2 = messenger_config->on_state_changed_context;
                  twin_msgr->on_state_changed_callback = messenger_config->on_state_changed_callback
                  ;
                  twin_msgr->on_state_changed_context = pvVar2;
                  goto LAB_001387a2;
                }
                p_Var4 = xlogging_get_log_function();
                if (p_Var4 != (LOGGER_LOG)0x0) {
                  pcVar7 = messenger_config->device_id;
                  pcVar6 = "Failed subscribing for AMQP messages (%s)";
                  iVar3 = 0x6d6;
                  goto LAB_00138782;
                }
              }
              internal_twin_messenger_destroy(twin_msgr);
              twin_msgr = (TWIN_MESSENGER_INSTANCE_conflict *)0x0;
LAB_001387a2:
              Map_Destroy(handle);
              return twin_msgr;
            }
            p_Var4 = xlogging_get_log_function();
            if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_00138421;
            pcVar7 = messenger_config->device_id;
            pcVar6 = "Failed creating link attach properties (%s)";
            iVar3 = 0x6b2;
          }
        }
      }
      else {
        p_Var4 = xlogging_get_log_function();
        if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_00138421;
        pcVar7 = messenger_config->device_id;
        pcVar6 = "Failed copying iothub_host_fqdn (%s)";
        iVar3 = 0x6a0;
      }
    }
    else {
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_00138421;
      pcVar7 = messenger_config->device_id;
      pcVar6 = "Failed copying module_id (%s)";
      iVar3 = 0x69a;
    }
  }
  else {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_00138421;
    pcVar7 = messenger_config->device_id;
    pcVar6 = "Failed copying device_id (%s)";
    iVar3 = 0x694;
  }
  (*p_Var4)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
            ,"twin_messenger_create",iVar3,1,pcVar6,pcVar7);
LAB_00138421:
  internal_twin_messenger_destroy(twin_msgr);
  return (TWIN_MESSENGER_HANDLE)0x0;
}

Assistant:

TWIN_MESSENGER_HANDLE twin_messenger_create(const TWIN_MESSENGER_CONFIG* messenger_config)
{
    TWIN_MESSENGER_INSTANCE* twin_msgr;

    if (messenger_config == NULL)
    {
        LogError("Invalid argument (messenger_config is NULL)");
        twin_msgr = NULL;
    }
    else if (messenger_config->device_id == NULL || messenger_config->iothub_host_fqdn == NULL || messenger_config->prod_info_cb == NULL)
    {
        LogError("Invalid argument (device_id=%p, iothub_host_fqdn=%p, client_version=%p)",
            messenger_config->device_id, messenger_config->iothub_host_fqdn, messenger_config->prod_info_cb);
        twin_msgr = NULL;
    }
    else
    {
        if ((twin_msgr = (TWIN_MESSENGER_INSTANCE*)malloc(sizeof(TWIN_MESSENGER_INSTANCE))) == NULL)
        {
            LogError("Failed allocating TWIN_MESSENGER_INSTANCE (%s)", messenger_config->device_id);
        }
        else
        {
            MAP_HANDLE link_attach_properties;

            memset(twin_msgr, 0, sizeof(TWIN_MESSENGER_INSTANCE));
            twin_msgr->state = TWIN_MESSENGER_STATE_STOPPED;
            twin_msgr->subscription_state = TWIN_SUBSCRIPTION_STATE_NOT_SUBSCRIBED;
            twin_msgr->amqp_msgr_state = AMQP_MESSENGER_STATE_STOPPED;

            twin_msgr->prod_info_cb = messenger_config->prod_info_cb;
            twin_msgr->prod_info_ctx = messenger_config->prod_info_ctx;

            if (mallocAndStrcpy_s(&twin_msgr->device_id, messenger_config->device_id) != 0)
            {
                LogError("Failed copying device_id (%s)", messenger_config->device_id);
                internal_twin_messenger_destroy(twin_msgr);
                twin_msgr = NULL;
            }
            else if ((messenger_config->module_id != NULL) && (mallocAndStrcpy_s(&twin_msgr->module_id, messenger_config->module_id) != 0))
            {
                LogError("Failed copying module_id (%s)", messenger_config->device_id);
                internal_twin_messenger_destroy(twin_msgr);
                twin_msgr = NULL;
            }
            else if (mallocAndStrcpy_s(&twin_msgr->iothub_host_fqdn, messenger_config->iothub_host_fqdn) != 0)
            {
                LogError("Failed copying iothub_host_fqdn (%s)", messenger_config->device_id);
                internal_twin_messenger_destroy(twin_msgr);
                twin_msgr = NULL;
            }
            else if ((twin_msgr->pending_patches = singlylinkedlist_create()) == NULL)
            {
                LogError("Failed creating list for queueing patches (%s)", messenger_config->device_id);
                internal_twin_messenger_destroy(twin_msgr);
                twin_msgr = NULL;
            }
            else if ((twin_msgr->operations = singlylinkedlist_create()) == NULL)
            {
                LogError("Failed creating list for operations (%s)", messenger_config->device_id);
                internal_twin_messenger_destroy(twin_msgr);
                twin_msgr = NULL;
            }
            else if ((link_attach_properties = create_link_attach_properties(twin_msgr)) == NULL)
            {
                LogError("Failed creating link attach properties (%s)", messenger_config->device_id);
                internal_twin_messenger_destroy(twin_msgr);
                twin_msgr = NULL;
            }
            else
            {
                twin_msgr->prod_info_cb = messenger_config->prod_info_cb;
                twin_msgr->prod_info_ctx = messenger_config->prod_info_ctx;

                AMQP_MESSENGER_CONFIG amqp_msgr_config;
                amqp_msgr_config.prod_info_cb = twin_msgr->prod_info_cb;
                amqp_msgr_config.prod_info_ctx = twin_msgr->prod_info_ctx;
                amqp_msgr_config.device_id = twin_msgr->device_id;
                amqp_msgr_config.module_id = twin_msgr->module_id;
                amqp_msgr_config.iothub_host_fqdn = twin_msgr->iothub_host_fqdn;
                amqp_msgr_config.send_link.target_suffix = DEFAULT_TWIN_SEND_LINK_SOURCE_NAME;
                amqp_msgr_config.send_link.attach_properties = link_attach_properties;
                amqp_msgr_config.send_link.snd_settle_mode = sender_settle_mode_settled;
                amqp_msgr_config.send_link.rcv_settle_mode = receiver_settle_mode_first;
                amqp_msgr_config.receive_link.source_suffix = DEFAULT_TWIN_RECEIVE_LINK_TARGET_NAME;
                amqp_msgr_config.receive_link.attach_properties = link_attach_properties;
                amqp_msgr_config.receive_link.snd_settle_mode = sender_settle_mode_settled;
                amqp_msgr_config.receive_link.rcv_settle_mode = receiver_settle_mode_first;
                amqp_msgr_config.on_state_changed_callback = on_amqp_messenger_state_changed_callback;
                amqp_msgr_config.on_state_changed_context = (void*)twin_msgr;
                amqp_msgr_config.on_subscription_changed_callback = on_amqp_messenger_subscription_changed_callback;
                amqp_msgr_config.on_subscription_changed_context = (void*)twin_msgr;

                if ((twin_msgr->amqp_msgr = amqp_messenger_create(&amqp_msgr_config)) == NULL)
                {
                    LogError("Failed creating the AMQP messenger (%s)", messenger_config->device_id);
                    internal_twin_messenger_destroy(twin_msgr);
                    twin_msgr = NULL;
                }
                else if (amqp_messenger_subscribe_for_messages(twin_msgr->amqp_msgr, on_amqp_message_received_callback, (void*)twin_msgr))
                {
                    LogError("Failed subscribing for AMQP messages (%s)", messenger_config->device_id);
                    internal_twin_messenger_destroy(twin_msgr);
                    twin_msgr = NULL;
                }
                else
                {
                    twin_msgr->on_state_changed_callback = messenger_config->on_state_changed_callback;

                    twin_msgr->on_state_changed_context = messenger_config->on_state_changed_context;
                }

                destroy_link_attach_properties(link_attach_properties);
            }
        }
    }

    return (TWIN_MESSENGER_HANDLE)twin_msgr;
}